

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

bool kratos::IterVar::has_iter_var(Var *var)

{
  VarType VVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  
  while( true ) {
    while( true ) {
      bVar2 = var != (Var *)0x0;
      if (var == (Var *)0x0) {
        return bVar2;
      }
      VVar1 = var->type_;
      if (VVar1 == Expression) break;
      if (VVar1 != Slice) {
        if (VVar1 == Iter) {
          return bVar2;
        }
        return false;
      }
      iVar4 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
      var = (Var *)CONCAT44(extraout_var,iVar4);
    }
    bVar3 = has_iter_var((Var *)var[1].super_IRNode.fn_name_ln.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    if (bVar3) break;
    var = (Var *)var[1].super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  }
  return bVar2;
}

Assistant:

bool IterVar::has_iter_var(const Var *var) {
    if (!var) return false;
    if (var->type() == VarType::Iter) return true;
    if (var->type() == VarType::Slice) {
        auto const *slice = reinterpret_cast<const VarSlice *>(var);
        return has_iter_var(slice->get_var_root_parent());
    } else if (var->type() == VarType::Expression) {
        auto const *expr = reinterpret_cast<const Expr *>(var);
        return has_iter_var(expr->left) || has_iter_var(expr->right);
    }
    return false;
}